

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *field)

{
  long *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  long *local_30;
  long *local_28;
  long *local_20;
  
  switch(((field->_M_t).
          super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>._M_t.
          super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
          super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl)->type_) {
  case Func:
    cast<wabt::FuncModuleField,wabt::ModuleField>((wabt *)&local_70,field);
    AppendField(this,(unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                      *)&local_70);
    local_20 = local_70;
    break;
  case Global:
    cast<wabt::GlobalModuleField,wabt::ModuleField>((wabt *)&local_68,field);
    AppendField(this,(unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                      *)&local_68);
    local_20 = local_68;
    break;
  case Import:
    cast<wabt::ImportModuleField,wabt::ModuleField>((wabt *)&local_60,field);
    AppendField(this,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                      *)&local_60);
    local_20 = local_60;
    break;
  case Export:
    cast<wabt::ExportModuleField,wabt::ModuleField>((wabt *)&local_58,field);
    AppendField(this,(unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                      *)&local_58);
    local_20 = local_58;
    break;
  case FuncType:
    cast<wabt::FuncTypeModuleField,wabt::ModuleField>((wabt *)&local_50,field);
    AppendField(this,(unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                      *)&local_50);
    local_20 = local_50;
    break;
  case Table:
    cast<wabt::TableModuleField,wabt::ModuleField>((wabt *)&local_48,field);
    AppendField(this,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                      *)&local_48);
    local_20 = local_48;
    break;
  case ElemSegment:
    cast<wabt::ElemSegmentModuleField,wabt::ModuleField>((wabt *)&local_40,field);
    AppendField(this,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                      *)&local_40);
    local_20 = local_40;
    break;
  case Memory:
    cast<wabt::MemoryModuleField,wabt::ModuleField>((wabt *)&local_38,field);
    AppendField(this,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                      *)&local_38);
    local_20 = local_38;
    break;
  case DataSegment:
    cast<wabt::DataSegmentModuleField,wabt::ModuleField>((wabt *)&local_30,field);
    AppendField(this,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                      *)&local_30);
    local_20 = local_30;
    break;
  case Start:
    cast<wabt::StartModuleField,wabt::ModuleField>((wabt *)&local_28,field);
    AppendField(this,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                      *)&local_28);
    local_20 = local_28;
    break;
  case Except:
    cast<wabt::ExceptionModuleField,wabt::ModuleField>((wabt *)&local_20,field);
    AppendField(this,(unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
                      *)&local_20);
    break;
  default:
    goto switchD_00d9610c_default;
  }
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
switchD_00d9610c_default:
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<ModuleField> field) {
  switch (field->type()) {
    case ModuleFieldType::Func:
      AppendField(cast<FuncModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Global:
      AppendField(cast<GlobalModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Import:
      AppendField(cast<ImportModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Export:
      AppendField(cast<ExportModuleField>(std::move(field)));
      break;

    case ModuleFieldType::FuncType:
      AppendField(cast<FuncTypeModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Table:
      AppendField(cast<TableModuleField>(std::move(field)));
      break;

    case ModuleFieldType::ElemSegment:
      AppendField(cast<ElemSegmentModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Memory:
      AppendField(cast<MemoryModuleField>(std::move(field)));
      break;

    case ModuleFieldType::DataSegment:
      AppendField(cast<DataSegmentModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Start:
      AppendField(cast<StartModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Except:
      AppendField(cast<ExceptionModuleField>(std::move(field)));
      break;
  }
}